

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SField.cpp
# Opt level: O2

SField * jbcoin::SField::getField(string *fieldName)

{
  __type _Var1;
  _Rb_tree_node_base *p_Var2;
  SField *pSVar3;
  
  for (p_Var2 = (_Rb_tree_node_base *)knownCodeToField._24_8_;
      p_Var2 != (_Rb_tree_node_base *)(knownCodeToField + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(p_Var2[1]._M_parent)->_M_left,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            fieldName);
    if (_Var1) {
      return (SField *)p_Var2[1]._M_parent;
    }
  }
  std::mutex::lock((mutex *)SField_mutex);
  pSVar3 = (SField *)&sfInvalid;
  p_Var2 = (_Rb_tree_node_base *)unknownCodeToField._24_8_;
  do {
    if (p_Var2 == (_Rb_tree_node_base *)(unknownCodeToField + 8)) {
LAB_001d4b60:
      pthread_mutex_unlock((pthread_mutex_t *)SField_mutex);
      return pSVar3;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(p_Var2[1]._M_parent)->_M_left,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            fieldName);
    if (_Var1) {
      pSVar3 = (SField *)p_Var2[1]._M_parent;
      goto LAB_001d4b60;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

SField const&
SField::getField (std::string const& fieldName)
{
    for (auto const & fieldPair : knownCodeToField)
    {
        if (fieldPair.second->fieldName == fieldName)
            return * (fieldPair.second);
    }
    {
        StaticScopedLockType sl (SField_mutex);

        for (auto const & fieldPair : unknownCodeToField)
        {
            if (fieldPair.second->fieldName == fieldName)
                return * (fieldPair.second);
        }
    }
    return sfInvalid;
}